

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMarker.cpp
# Opt level: O3

void __thiscall chrono::ChMarker::UpdateTime(ChMarker *this,double mytime)

{
  ChQuaternion<double> *pCVar1;
  ChFrameMoving<double> *this_00;
  ChQuaternion<double> *quat;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined8 in_XMM0_Qb;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Vector motion_axis_versor;
  ChCoordsys<double> local_150;
  double local_118;
  undefined8 uStack_110;
  double local_108;
  ChCoordsys<double> local_100;
  ChCoordsys<double> local_c8;
  ChQuaternion<double> local_88;
  ChQuaternion<double> local_68;
  ChVector<double> local_40;
  
  local_150.pos.m_data[2] = 0.0;
  local_c8.rot.m_data[0] = 1.0;
  local_150.rot.m_data[0] = 1.0;
  local_100.rot.m_data[0] = 1.0;
  local_c8.rot.m_data[1] = 0.0;
  local_c8.rot.m_data[2] = 0.0;
  local_150.rot.m_data[1] = 0.0;
  local_150.rot.m_data[2] = 0.0;
  local_100.rot.m_data[1] = 0.0;
  local_100.rot.m_data[2] = 0.0;
  local_c8.rot.m_data[3] = 0.0;
  local_150.rot.m_data[3] = 0.0;
  local_100.rot.m_data[3] = 0.0;
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  local_68.m_data[2] = 0.0;
  local_68.m_data[3] = 0.0;
  (this->super_ChObj).ChTime = mytime;
  if (this->motion_type - M_MOTION_KEYFRAMED < 2) {
    return;
  }
  dVar9 = mytime;
  (*((this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  uVar10 = 0;
  dVar7 = mytime;
  local_c8.pos.m_data[0] = dVar9;
  (*((this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  dVar8 = mytime;
  local_118 = dVar7;
  uStack_110 = uVar10;
  local_c8.pos.m_data[1] = dVar7;
  (*((this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  local_108 = dVar8;
  local_c8.pos.m_data[2] = dVar8;
  iVar6 = (*((this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[3])();
  if (iVar6 != 8) {
    auVar3._8_8_ = in_XMM0_Qb;
    auVar3._0_8_ = dVar9;
    auVar4._8_8_ = uStack_110;
    auVar4._0_8_ = local_118;
    auVar3 = vunpcklpd_avx(auVar3,auVar4);
    local_c8.pos.m_data[0] = auVar3._0_8_ + (this->rest_coord).pos.m_data[0];
    local_c8.pos.m_data[1] = auVar3._8_8_ + (this->rest_coord).pos.m_data[1];
    local_c8.pos.m_data[2] = local_108 + (this->rest_coord).pos.m_data[2];
  }
  quat = &local_c8.rot;
  dVar8 = mytime;
  (*((this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[5])();
  dVar9 = mytime;
  local_150.pos.m_data[0] = dVar8;
  (*((this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[5])();
  dVar8 = mytime;
  local_150.pos.m_data[1] = dVar9;
  (*((this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[5])();
  dVar9 = mytime;
  local_150.pos.m_data[2] = dVar8;
  (*((this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[6])();
  dVar8 = mytime;
  local_100.pos.m_data[0] = dVar9;
  (*((this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[6])();
  dVar9 = mytime;
  local_100.pos.m_data[1] = dVar8;
  (*((this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[6])();
  dVar8 = mytime;
  local_100.pos.m_data[2] = dVar9;
  (*((this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  dVar9 = mytime;
  local_118 = dVar8;
  (*((this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[5])();
  (*((this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[6])();
  if (((((local_118 != 0.0) || (NAN(local_118))) || (dVar9 != 0.0)) ||
      ((NAN(dVar9) || (mytime != 0.0)))) || (NAN(mytime))) {
    dVar8 = (this->motion_axis).m_data[1];
    dVar7 = (this->motion_axis).m_data[0];
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar7;
    dVar2 = (this->motion_axis).m_data[2];
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar2;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar8 * dVar8;
    auVar3 = vfmadd231sd_fma(auVar13,auVar14,auVar14);
    auVar3 = vfmadd231sd_fma(auVar3,auVar11,auVar11);
    auVar3 = vsqrtsd_avx(auVar3,auVar3);
    bVar5 = 2.2250738585072014e-308 <= auVar3._0_8_;
    dVar12 = 1.0 / auVar3._0_8_;
    local_40.m_data[0] =
         (double)((ulong)bVar5 * (long)(dVar7 * dVar12) + (ulong)!bVar5 * 0x3ff0000000000000);
    local_40.m_data[1] = (double)((ulong)bVar5 * (long)(dVar8 * dVar12));
    local_40.m_data[2] = (double)((ulong)bVar5 * (long)(dVar2 * dVar12));
    Q_from_AngAxis(&local_88,local_118,&local_40);
    local_68.m_data[0] = local_88.m_data[0];
    local_68.m_data[1] = local_88.m_data[1];
    local_68.m_data[2] = local_88.m_data[2];
    local_68.m_data[3] = local_88.m_data[3];
    Qcross(&local_68,&(this->rest_coord).rot);
    local_c8.rot.m_data[0] = local_88.m_data[0];
    local_c8.rot.m_data[1] = local_88.m_data[1];
    local_c8.rot.m_data[2] = local_88.m_data[2];
    local_c8.rot.m_data[3] = local_88.m_data[3];
    Qdt_from_AngAxis(&local_88,quat,dVar9,&local_40);
    local_150.rot.m_data[0] = local_88.m_data[0];
    local_150.rot.m_data[1] = local_88.m_data[1];
    local_150.rot.m_data[2] = local_88.m_data[2];
    local_150.rot.m_data[3] = local_88.m_data[3];
    Qdtdt_from_AngAxis(&local_88,mytime,&local_40,quat,&local_150.rot);
    local_100.rot.m_data[0] = local_88.m_data[0];
    local_100.rot.m_data[1] = local_88.m_data[1];
    local_100.rot.m_data[2] = local_88.m_data[2];
    local_100.rot.m_data[3] = local_88.m_data[3];
  }
  else {
    pCVar1 = &(this->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot;
    if (pCVar1 != quat) {
      local_c8.rot.m_data[0] = pCVar1->m_data[0];
      local_c8.rot.m_data[1] =
           (this->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
      local_c8.rot.m_data[2] =
           (this->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
      local_c8.rot.m_data[3] =
           (this->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
    }
    local_150.rot.m_data[0] = QNULL;
    local_150.rot.m_data[1] = DAT_00b68838;
    local_150.rot.m_data[2] = DAT_00b68840;
    local_150.rot.m_data[3] = DAT_00b68848;
    local_100.rot.m_data[0] = QNULL;
    local_100.rot.m_data[1] = DAT_00b68838;
    local_100.rot.m_data[2] = DAT_00b68840;
    local_100.rot.m_data[3] = DAT_00b68848;
  }
  this_00 = &this->super_ChFrameMoving<double>;
  bVar5 = ChCoordsys<double>::operator==
                    (&local_c8,&(this->super_ChFrameMoving<double>).super_ChFrame<double>.coord);
  if (!bVar5) {
    ChFrame<double>::SetCoord(&this_00->super_ChFrame<double>,&local_c8);
  }
  bVar5 = ChCoordsys<double>::operator==(&local_150,&(this->super_ChFrameMoving<double>).coord_dt);
  if ((((bVar5) && (QNULL == local_150.rot.m_data[0])) &&
      ((!NAN(QNULL) && !NAN(local_150.rot.m_data[0]) &&
       (((DAT_00b68838 == local_150.rot.m_data[1] &&
         (!NAN(DAT_00b68838) && !NAN(local_150.rot.m_data[1]))) &&
        (DAT_00b68840 == local_150.rot.m_data[2])))))) &&
     (!NAN(DAT_00b68840) && !NAN(local_150.rot.m_data[2]))) {
    if ((DAT_00b68848 == local_150.rot.m_data[3]) &&
       (!NAN(DAT_00b68848) && !NAN(local_150.rot.m_data[3]))) goto LAB_004fa345;
  }
  (*(this_00->super_ChFrame<double>)._vptr_ChFrame[6])(this_00,&local_150);
LAB_004fa345:
  bVar5 = ChCoordsys<double>::operator==(&local_100,&(this->super_ChFrameMoving<double>).coord_dtdt)
  ;
  if (bVar5) {
    if ((QNULL == local_100.rot.m_data[0]) && (!NAN(QNULL) && !NAN(local_100.rot.m_data[0]))) {
      if ((DAT_00b68838 == local_100.rot.m_data[1]) &&
         (!NAN(DAT_00b68838) && !NAN(local_100.rot.m_data[1]))) {
        if ((DAT_00b68840 == local_100.rot.m_data[2]) &&
           (!NAN(DAT_00b68840) && !NAN(local_100.rot.m_data[2]))) {
          if ((DAT_00b68848 == local_100.rot.m_data[3]) &&
             (!NAN(DAT_00b68848) && !NAN(local_100.rot.m_data[3]))) {
            return;
          }
        }
      }
    }
  }
  (*(this_00->super_ChFrame<double>)._vptr_ChFrame[0xb])(this_00,&local_100);
  return;
}

Assistant:

void ChMarker::UpdateTime(double mytime) {
    Coordsys csys, csys_dt, csys_dtdt;
    Quaternion qtemp;
    double ang, ang_dt, ang_dtdt;

    ChTime = mytime;

    // if a imposed motion (keyframed movement) affects the marker position (example,from R3D animation system),
    // compute the speed and acceleration values by BDF (example,see the UpdatedExternalTime() function, later)
    // so the updating via motion laws can be skipped!
    if (motion_type == M_MOTION_KEYFRAMED)
        return;

    // skip relative-position-functions evaluation also if
    // someone is already handling this from outside..
    if (motion_type == M_MOTION_EXTERNAL)
        return;

    // positions:
    // update positions:    rel_pos
    csys.pos.x() = motion_X->Get_y(mytime);
    csys.pos.y() = motion_Y->Get_y(mytime);
    csys.pos.z() = motion_Z->Get_y(mytime);
    if (motion_X->Get_Type() != ChFunction::FUNCT_MOCAP)
        csys.pos += rest_coord.pos;

    // update speeds:		rel_pos_dt
    csys_dt.pos.x() = motion_X->Get_y_dx(mytime);
    csys_dt.pos.y() = motion_Y->Get_y_dx(mytime);
    csys_dt.pos.z() = motion_Z->Get_y_dx(mytime);

    // update accelerations
    csys_dtdt.pos.x() = motion_X->Get_y_dxdx(mytime);
    csys_dtdt.pos.y() = motion_Y->Get_y_dxdx(mytime);
    csys_dtdt.pos.z() = motion_Z->Get_y_dxdx(mytime);

    // rotations:

    ang = motion_ang->Get_y(mytime);
    ang_dt = motion_ang->Get_y_dx(mytime);
    ang_dtdt = motion_ang->Get_y_dxdx(mytime);

    if ((ang != 0) || (ang_dt != 0) || (ang_dtdt != 0)) {
        // update q
        Vector motion_axis_versor = Vnorm(motion_axis);
        qtemp = Q_from_AngAxis(ang, motion_axis_versor);
        csys.rot = Qcross(qtemp, rest_coord.rot);
        // update q_dt
        csys_dt.rot = chrono::Qdt_from_AngAxis(csys.rot, ang_dt, motion_axis_versor);
        // update q_dtdt
        csys_dtdt.rot = chrono::Qdtdt_from_AngAxis(ang_dtdt, motion_axis_versor, csys.rot, csys_dt.rot);
    } else {
        csys.rot = coord.rot;  // rel_pos.rot;
        csys_dt.rot = QNULL;
        csys_dtdt.rot = QNULL;
    }

    // Set the position, speed and acceleration in relative space,
    // automatically getting also the absolute values,
    if (!(csys == this->coord))
        SetCoord(csys);

    if (!(csys_dt == this->coord_dt) || !(csys_dt.rot == QNULL))
        SetCoord_dt(csys_dt);

    if (!(csys_dtdt == this->coord_dtdt) || !(csys_dtdt.rot == QNULL))
        SetCoord_dtdt(csys_dtdt);
}